

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

ssize_t __thiscall
capnp::anon_unknown_34::BrokenRequest::send
          (BrokenRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar1;
  BrokenPipeline *pBVar2;
  undefined4 in_register_00000034;
  Exception *other;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1f8;
  Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t> local_1f0;
  Own<capnp::PipelineHook,_std::nullptr_t> local_1e0;
  Pipeline local_1d0;
  Exception local_1a8;
  
  other = (Exception *)(CONCAT44(in_register_00000034,__fd) + 0x10);
  kj::Exception::Exception(&local_1a8,other);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise
            ((Promise<capnp::Response<capnp::AnyPointer>_> *)&local_1f8,&local_1a8);
  kj::refcounted<capnp::(anonymous_namespace)::BrokenPipeline,kj::Exception&>
            ((kj *)&local_1f0,other);
  pBVar2 = local_1f0.ptr;
  OVar1.ptr = local_1f8.ptr;
  local_1e0.disposer = local_1f0.disposer;
  local_1f0.ptr = (BrokenPipeline *)0x0;
  local_1e0.ptr = (PipelineHook *)0x0;
  local_1d0.hook.disposer = local_1f0.disposer;
  local_1d0.ops.disposer = (ArrayDisposer *)0x0;
  local_1f8.ptr = (PromiseNode *)0x0;
  (this->super_RequestHook)._vptr_RequestHook = (_func_int **)OVar1.ptr;
  local_1d0.hook.ptr = (PipelineHook *)0x0;
  (this->super_RequestHook).brand = local_1f0.disposer;
  (this->exception).ownFile.content.ptr = (char *)pBVar2;
  (this->exception).ownFile.content.size_ = 0;
  (this->exception).ownFile.content.disposer = (ArrayDisposer *)0x0;
  (this->exception).file = (char *)0x0;
  local_1d0.ops.ptr = (PipelineOp *)0x0;
  local_1d0.ops.size_ = 0;
  AnyPointer::Pipeline::~Pipeline(&local_1d0);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_1e0);
  kj::Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t>::~Own(&local_1f0);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1f8);
  kj::Exception::~Exception(&local_1a8);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
    return RemotePromise<AnyPointer>(kj::cp(exception),
        AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception)));
  }